

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O3

void __thiscall
kj::StringTree::StringTree(StringTree *this,Array<kj::StringTree> *pieces,StringPtr delim)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  Branch *pBVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  StringTree *pSVar7;
  ulong uVar8;
  size_t __n;
  uint uVar9;
  String local_48;
  
  (this->text).content.size_ = 0;
  (this->text).content.disposer = (ArrayDisposer *)0x0;
  this->size_ = 0;
  (this->text).content.ptr = (char *)0x0;
  sVar6 = pieces->size_;
  pBVar3 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar6,sVar6,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  (this->branches).ptr = pBVar3;
  (this->branches).size_ = sVar6;
  (this->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  sVar6 = pieces->size_;
  if (sVar6 != 0) {
    if ((sVar6 != 1) && (lVar4 = delim.content.size_ - 1, lVar4 != 0)) {
      heapString(&local_48,(sVar6 - 1) * lVar4);
      pcVar5 = (this->text).content.ptr;
      if (pcVar5 != (char *)0x0) {
        sVar6 = (this->text).content.size_;
        (this->text).content.ptr = (char *)0x0;
        (this->text).content.size_ = 0;
        pAVar1 = (this->text).content.disposer;
        (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar6,sVar6,0);
      }
      (this->text).content.ptr = local_48.content.ptr;
      (this->text).content.size_ = local_48.content.size_;
      (this->text).content.disposer = local_48.content.disposer;
      sVar6 = 0;
      if (local_48.content.size_ != 0) {
        sVar6 = local_48.content.size_ - 1;
      }
      this->size_ = sVar6;
      pBVar3 = (this->branches).ptr;
    }
    pBVar3->index = 0;
    pSVar7 = pieces->ptr;
    (pBVar3->content).size_ = pSVar7->size_;
    pcVar5 = (pBVar3->content).text.content.ptr;
    if (pcVar5 != (char *)0x0) {
      sVar6 = (pBVar3->content).text.content.size_;
      (pBVar3->content).text.content.ptr = (char *)0x0;
      (pBVar3->content).text.content.size_ = 0;
      pAVar1 = (pBVar3->content).text.content.disposer;
      (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar6,sVar6,0);
    }
    (pBVar3->content).text.content.ptr = (pSVar7->text).content.ptr;
    (pBVar3->content).text.content.size_ = (pSVar7->text).content.size_;
    (pBVar3->content).text.content.disposer = (pSVar7->text).content.disposer;
    (pSVar7->text).content.ptr = (char *)0x0;
    (pSVar7->text).content.size_ = 0;
    pBVar2 = (pBVar3->content).branches.ptr;
    if (pBVar2 != (Branch *)0x0) {
      sVar6 = (pBVar3->content).branches.size_;
      (pBVar3->content).branches.ptr = (Branch *)0x0;
      (pBVar3->content).branches.size_ = 0;
      pAVar1 = (pBVar3->content).branches.disposer;
      (**pAVar1->_vptr_ArrayDisposer)
                (pAVar1,pBVar2,0x40,sVar6,sVar6,
                 ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    (pBVar3->content).branches.ptr = (pSVar7->branches).ptr;
    (pBVar3->content).branches.size_ = (pSVar7->branches).size_;
    (pBVar3->content).branches.disposer = (pSVar7->branches).disposer;
    (pSVar7->branches).ptr = (Branch *)0x0;
    (pSVar7->branches).size_ = 0;
    pSVar7 = pieces->ptr;
    this->size_ = this->size_ + pSVar7->size_;
    if (1 < pieces->size_) {
      __n = delim.content.size_ - 1;
      uVar8 = 1;
      uVar9 = 2;
      do {
        if (__n != 0) {
          pcVar5 = (char *)(this->text).content.size_;
          if (pcVar5 != (char *)0x0) {
            pcVar5 = (this->text).content.ptr;
          }
          memcpy(pcVar5 + (uVar9 - 2) * __n,delim.content.ptr,__n);
          pSVar7 = pieces->ptr;
        }
        pBVar3 = (this->branches).ptr;
        pBVar3[uVar8].index = uVar8 * __n;
        pBVar3[uVar8].content.size_ = pSVar7[uVar8].size_;
        pcVar5 = pBVar3[uVar8].content.text.content.ptr;
        if (pcVar5 != (char *)0x0) {
          sVar6 = pBVar3[uVar8].content.text.content.size_;
          pBVar3[uVar8].content.text.content.ptr = (char *)0x0;
          pBVar3[uVar8].content.text.content.size_ = 0;
          pAVar1 = pBVar3[uVar8].content.text.content.disposer;
          (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar6,sVar6,0);
        }
        pBVar3[uVar8].content.text.content.ptr = pSVar7[uVar8].text.content.ptr;
        pBVar3[uVar8].content.text.content.size_ = pSVar7[uVar8].text.content.size_;
        pBVar3[uVar8].content.text.content.disposer = pSVar7[uVar8].text.content.disposer;
        pSVar7[uVar8].text.content.ptr = (char *)0x0;
        pSVar7[uVar8].text.content.size_ = 0;
        pBVar2 = pBVar3[uVar8].content.branches.ptr;
        if (pBVar2 != (Branch *)0x0) {
          sVar6 = pBVar3[uVar8].content.branches.size_;
          pBVar3[uVar8].content.branches.ptr = (Branch *)0x0;
          pBVar3[uVar8].content.branches.size_ = 0;
          pAVar1 = pBVar3[uVar8].content.branches.disposer;
          (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pBVar2,0x40,sVar6,sVar6);
        }
        pBVar3[uVar8].content.branches.ptr = pSVar7[uVar8].branches.ptr;
        pBVar3[uVar8].content.branches.size_ = pSVar7[uVar8].branches.size_;
        pBVar3[uVar8].content.branches.disposer = pSVar7[uVar8].branches.disposer;
        pSVar7[uVar8].branches.ptr = (Branch *)0x0;
        pSVar7[uVar8].branches.size_ = 0;
        pSVar7 = pieces->ptr;
        this->size_ = this->size_ + pSVar7[uVar8].size_;
        uVar8 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar8 < pieces->size_);
    }
  }
  return;
}

Assistant:

StringTree::StringTree(Array<StringTree>&& pieces, StringPtr delim)
    : size_(0),
      branches(heapArray<Branch>(pieces.size())) {
  if (pieces.size() > 0) {
    if (pieces.size() > 1 && delim.size() > 0) {
      text = heapString((pieces.size() - 1) * delim.size());
      size_ = text.size();
    }

    branches[0].index = 0;
    branches[0].content = kj::mv(pieces[0]);
    size_ += pieces[0].size();

    for (uint i = 1; i < pieces.size(); i++) {
      if (delim.size() > 0) {
        memcpy(text.begin() + (i - 1) * delim.size(), delim.begin(), delim.size());
      }
      branches[i].index = i * delim.size();
      branches[i].content = kj::mv(pieces[i]);
      size_ += pieces[i].size();
    }
  }
}